

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

nbt_node * nbt_filter(nbt_node *tree,nbt_predicate_t filter,void *aux)

{
  long lVar1;
  _Bool _Var2;
  int *piVar3;
  nbt_node *__ptr;
  char *pcVar4;
  uchar *puVar5;
  nbt_list *pnVar6;
  nbt_node *ret;
  void *aux_local;
  nbt_predicate_t filter_local;
  nbt_node *tree_local;
  
  if (filter == (nbt_predicate_t)0x0) {
    __assert_fail("filter",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x10c,"nbt_node *nbt_filter(const nbt_node *, nbt_predicate_t, void *)");
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (tree == (nbt_node *)0x0) {
    return (nbt_node *)0x0;
  }
  _Var2 = (*filter)(tree,aux);
  if (!_Var2) {
    return (nbt_node *)0x0;
  }
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = -2;
  }
  else {
    __ptr->type = tree->type;
    pcVar4 = safe_strdup(tree->name);
    __ptr->name = pcVar4;
    if ((tree->name == (char *)0x0) || (__ptr->name != (char *)0x0)) {
      if (tree->type == TAG_STRING) {
        pcVar4 = _nbt_strdup((tree->payload).tag_string);
        (__ptr->payload).tag_string = pcVar4;
        lVar1 = (__ptr->payload).tag_long;
      }
      else {
        if (tree->type == TAG_BYTE_ARRAY) {
          puVar5 = (uchar *)malloc((long)(tree->payload).tag_byte_array.length);
          (__ptr->payload).tag_byte_array.data = puVar5;
          if (puVar5 != (uchar *)0x0) {
            memcpy((__ptr->payload).tag_byte_array.data,(tree->payload).tag_byte_array.data,
                   (long)(tree->payload).tag_byte_array.length);
            (__ptr->payload).tag_byte_array.length = (tree->payload).tag_byte_array.length;
            return __ptr;
          }
          piVar3 = __errno_location();
          *piVar3 = -2;
          goto LAB_00105aeb;
        }
        if (tree->type == TAG_INT_ARRAY) {
          puVar5 = (uchar *)malloc((long)(tree->payload).tag_byte_array.length << 2);
          (__ptr->payload).tag_byte_array.data = puVar5;
          if (puVar5 != (uchar *)0x0) {
            memcpy((__ptr->payload).tag_byte_array.data,(tree->payload).tag_byte_array.data,
                   (long)(tree->payload).tag_byte_array.length);
            (__ptr->payload).tag_byte_array.length = (tree->payload).tag_byte_array.length;
            return __ptr;
          }
          piVar3 = __errno_location();
          *piVar3 = -2;
          goto LAB_00105aeb;
        }
        if (tree->type == TAG_LIST) {
          pnVar6 = filter_list((tree->payload).tag_list,filter,aux);
          (__ptr->payload).tag_list = pnVar6;
          lVar1 = (__ptr->payload).tag_long;
        }
        else {
          if (tree->type != TAG_COMPOUND) {
            (__ptr->payload).tag_long = (tree->payload).tag_long;
            *(undefined8 *)((long)&__ptr->payload + 8) = *(undefined8 *)((long)&tree->payload + 8);
            return __ptr;
          }
          pnVar6 = filter_list((tree->payload).tag_list,filter,aux);
          (__ptr->payload).tag_list = pnVar6;
          lVar1 = (__ptr->payload).tag_long;
        }
      }
      if (lVar1 != 0) {
        return __ptr;
      }
    }
  }
LAB_00105aeb:
  piVar3 = __errno_location();
  if (*piVar3 == 0) {
    piVar3 = __errno_location();
    *piVar3 = -2;
  }
  if (__ptr != (nbt_node *)0x0) {
    free(__ptr->name);
  }
  free(__ptr);
  return (nbt_node *)0x0;
}

Assistant:

nbt_node* nbt_filter(const nbt_node* tree, nbt_predicate_t filter, void* aux)
{
    assert(filter);

    errno = NBT_OK;

    if(tree == NULL)       return NULL;
    if(!filter(tree, aux)) return NULL;

    nbt_node* ret = NULL;
    CHECKED_MALLOC(ret, sizeof *ret, goto filter_error);

    ret->type = tree->type;
    ret->name = safe_strdup(tree->name);

    if(tree->name && ret->name == NULL) goto filter_error;

    if(tree->type == TAG_STRING)
    {
        ret->payload.tag_string = _nbt_strdup(tree->payload.tag_string);
        if(ret->payload.tag_string == NULL) goto filter_error;
    }

    else if(tree->type == TAG_BYTE_ARRAY)
    {
        CHECKED_MALLOC(ret->payload.tag_byte_array.data,
                       tree->payload.tag_byte_array.length,
                       goto filter_error);

        memcpy(ret->payload.tag_byte_array.data,
               tree->payload.tag_byte_array.data,
               tree->payload.tag_byte_array.length);

        ret->payload.tag_byte_array.length = tree->payload.tag_byte_array.length;
    }

    else if(tree->type == TAG_INT_ARRAY)
    {
        CHECKED_MALLOC(ret->payload.tag_int_array.data,
                       tree->payload.tag_int_array.length * sizeof(int32_t),
                       goto filter_error);

        memcpy(ret->payload.tag_int_array.data,
               tree->payload.tag_int_array.data,
               tree->payload.tag_int_array.length);

        ret->payload.tag_int_array.length = tree->payload.tag_int_array.length;
    }

    /* Okay, we want to keep this node, but keep traversing the tree! */
    else if(tree->type == TAG_LIST)
    {
        ret->payload.tag_list = filter_list(tree->payload.tag_list, filter, aux);
        if(ret->payload.tag_list == NULL) goto filter_error;
    }
    else if(tree->type == TAG_COMPOUND)
    {
        ret->payload.tag_compound = filter_list(tree->payload.tag_compound, filter, aux);
        if(ret->payload.tag_compound == NULL) goto filter_error;
    }
    else
    {
        ret->payload = tree->payload;
    }

    return ret;

filter_error:
    if(errno == NBT_OK)
        errno = NBT_EMEM;

    if(ret) free(ret->name);

    free(ret);
    return NULL;
}